

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O2

value_type __thiscall
jsoncons::jsonpath::detail::
to_number_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
evaluate(to_number_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
         *this,vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               *args,error_code *ec)

{
  char *pcVar1;
  json_type jVar2;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar3;
  uint64_t uVar4;
  error_code *in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  _Storage<unsigned_long,_true> _Var6;
  string_view_type sVar7;
  type tVar8;
  type tVar9;
  value_type vVar10;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> arg0;
  int64_t sn;
  uint64_t un;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  chars_to to_double;
  
  pcVar1 = *(char **)ec;
  if ((pointer)(((long)ec->_M_cat - (long)pcVar1) / 0x18) !=
      (args->
      super__Vector_base<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::error_code::operator=(in_RCX,invalid_arity);
    pbVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,pbVar3);
    uVar5 = extraout_RDX;
    goto LAB_002fba32;
  }
  if (*pcVar1 == '\0') {
    pbVar3 = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)(pcVar1 + 8);
  }
  else {
    pbVar3 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)(pcVar1 + 8);
  }
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy(&arg0,pbVar3)
  ;
  jVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::type(&arg0);
  if ((jVar2 - 2 < 2) || (jVar2 == double_value)) {
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_move
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,&arg0);
  }
  else if (jVar2 == string_value) {
    sVar7 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view(&arg0);
    un = 0;
    tVar8 = jsoncons::detail::to_integer<unsigned_long,char>(sVar7._M_str,sVar7._M_len,&un);
    if (tVar8.ec == success) {
      *(undefined2 *)
       &(this->
        super_function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        )._vptr_function_base = 3;
      uVar4 = un;
    }
    else {
      sn = 0;
      tVar9 = jsoncons::detail::to_integer<long,char>(sVar7._M_str,sVar7._M_len,&sn);
      if (tVar9.ec != success) {
        jsoncons::detail::chars_to::chars_to(&to_double);
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
        as_string<std::allocator<char>>
                  (&s,(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)&arg0);
        _Var6 = (_Storage<unsigned_long,_true>)
                jsoncons::detail::chars_to::operator()
                          (&to_double,s._M_dataplus._M_p,s._M_string_length);
        *(undefined2 *)
         &(this->
          super_function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          )._vptr_function_base = 5;
        (this->
        super_function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        ).arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload = _Var6;
        std::__cxx11::string::~string((string *)&s);
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  ((_Vector_base<char,_std::allocator<char>_> *)&to_double);
        goto LAB_002fba2a;
      }
      *(undefined2 *)
       &(this->
        super_function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        )._vptr_function_base = 2;
      uVar4 = sn;
    }
    (this->
    super_function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
    ).arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = uVar4;
  }
  else {
    std::error_code::operator=(in_RCX,invalid_type);
    pbVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,pbVar3);
  }
LAB_002fba2a:
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json(&arg0);
  uVar5 = extraout_RDX_00;
LAB_002fba32:
  vVar10.field_0.int64_.val_ = uVar5;
  vVar10.field_0._0_8_ = this;
  return (value_type)vVar10.field_0;
}

Assistant:

value_type evaluate(const std::vector<parameter_type>& args, 
            std::error_code& ec) const override
        {
            if (args.size() != *this->arity())
            {
                ec = jsonpath_errc::invalid_arity;
                return value_type::null();
            }

            auto arg0= args[0].value();
            switch (arg0.type())
            {
                case json_type::int64_value:
                case json_type::uint64_value:
                case json_type::double_value:
                    return arg0;
                case json_type::string_value:
                {
                    auto sv = arg0.as_string_view();
                    uint64_t un{0};
                    auto result1 = jsoncons::detail::to_integer(sv.data(), sv.length(), un);
                    if (result1)
                    {
                        return value_type(un, semantic_tag::none);
                    }
                    int64_t sn{0};
                    auto result2 = jsoncons::detail::to_integer(sv.data(), sv.length(), sn);
                    if (result2)
                    {
                        return value_type(sn, semantic_tag::none);
                    }
                    const jsoncons::detail::chars_to to_double;
                    try
                    {
                        auto s = arg0.as_string();
                        double d = to_double(s.c_str(), s.length());
                        return value_type(d, semantic_tag::none);
                    }
                    catch (const std::exception&)
                    {
                        return value_type::null();
                    }
                }
                default:
                    ec = jsonpath_errc::invalid_type;
                    return value_type::null();
            }
        }